

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

int despot::Variable::ComputeCurrentIndex
              (vector<despot::Variable_*,_std::allocator<despot::Variable_*>_> *vars)

{
  long lVar1;
  int iVar2;
  int i;
  long lVar3;
  
  iVar2 = 0;
  for (lVar3 = 0; *(long *)(vars + 8) - *(long *)vars >> 3 != lVar3; lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(*(long *)vars + lVar3 * 8);
    iVar2 = iVar2 * (int)((ulong)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8)) >> 5) +
            *(int *)(lVar1 + 0x50);
  }
  return iVar2;
}

Assistant:

int Variable::ComputeCurrentIndex(const vector<Variable*>& vars) {
	int index = 0;
	for (int i = 0; i < vars.size(); i++) {
		Variable* var = vars[i];
		index = index * var->Size() + var->curr_value;
	}
	return index;
}